

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

String * __thiscall
asl::Map<asl::String,_asl::String>::operator[](Map<asl::String,_asl::String> *this,String *key)

{
  String *n;
  uint k;
  KeyVal *pKVar1;
  String local_70;
  KeyVal local_58;
  uint local_24;
  String *pSStack_20;
  int i;
  String *key_local;
  Map<asl::String,_asl::String> *this_local;
  
  pSStack_20 = key;
  key_local = (String *)this;
  local_24 = indexOf(this,key);
  n = pSStack_20;
  if ((int)local_24 < 0) {
    k = ~local_24;
    asl::String::String(&local_70);
    KeyVal::KeyVal(&local_58,n,&local_70);
    Array<asl::Map<asl::String,_asl::String>::KeyVal>::insert(&this->a,k,&local_58);
    KeyVal::~KeyVal(&local_58);
    asl::String::~String(&local_70);
    pKVar1 = Array<asl::Map<asl::String,_asl::String>::KeyVal>::operator[](&this->a,-1 - local_24);
  }
  else {
    pKVar1 = Array<asl::Map<asl::String,_asl::String>::KeyVal>::operator[](&this->a,local_24);
  }
  this_local = (Map<asl::String,_asl::String> *)&pKVar1->value;
  return (String *)this_local;
}

Assistant:

T& Map<K,T>::operator[](const K& key)
{
	int i = indexOf(key);
	if(i >= 0)
		return a[i].value;
	else
	{
		a.insert(-i-1, KeyVal(key, T()));
		return a[-i-1].value;
	}
}